

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiIO::ClearInputKeys(ImGuiIO *this)

{
  long in_RDI;
  int n_1;
  int n;
  undefined4 local_10;
  undefined4 local_c;
  
  memset((void *)(in_RDI + 0xb04),0,0x285);
  for (local_c = 0; local_c < 0x285; local_c = local_c + 1) {
    *(undefined1 *)(in_RDI + 0xdfc + (long)local_c * 0x10) = 0;
    *(undefined4 *)(in_RDI + (long)local_c * 0x10 + 0xe00) = 0xbf800000;
    *(undefined4 *)(in_RDI + (long)local_c * 0x10 + 0xe04) = 0xbf800000;
  }
  *(undefined1 *)(in_RDI + 0xda7) = 0;
  *(undefined1 *)(in_RDI + 0xda6) = 0;
  *(undefined1 *)(in_RDI + 0xda5) = 0;
  *(undefined1 *)(in_RDI + 0xda4) = 0;
  *(undefined4 *)(in_RDI + 0xdf8) = 0;
  for (local_10 = 0; local_10 < 0x14; local_10 = local_10 + 1) {
    *(undefined4 *)(in_RDI + 0x3764 + (long)local_10 * 4) = 0xbf800000;
    *(undefined4 *)(in_RDI + 0x3714 + (long)local_10 * 4) = 0xbf800000;
  }
  return;
}

Assistant:

void ImGuiIO::ClearInputKeys()
{
#ifndef IMGUI_DISABLE_OBSOLETE_KEYIO
    memset(KeysDown, 0, sizeof(KeysDown));
#endif
    for (int n = 0; n < IM_ARRAYSIZE(KeysData); n++)
    {
        KeysData[n].Down             = false;
        KeysData[n].DownDuration     = -1.0f;
        KeysData[n].DownDurationPrev = -1.0f;
    }
    KeyCtrl = KeyShift = KeyAlt = KeySuper = false;
    KeyMods = ImGuiKeyModFlags_None;
    for (int n = 0; n < IM_ARRAYSIZE(NavInputsDownDuration); n++)
        NavInputsDownDuration[n] = NavInputsDownDurationPrev[n] = -1.0f;
}